

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBoxPrivate::rowsRemoved(QComboBoxPrivate *this,QModelIndex *parent,int param_3,int param_4)

{
  bool bVar1;
  int iVar2;
  QComboBoxPrivate *this_00;
  ulong uVar3;
  int *b;
  undefined4 in_ECX;
  int in_EDX;
  QComboBoxPrivate *in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QWidget *in_stack_ffffffffffffff38;
  QComboBoxPrivate *in_stack_ffffffffffffff40;
  QComboBox *in_stack_ffffffffffffff50;
  QAbstractItemModel *this_01;
  QComboBoxPrivate *this_02;
  QPersistentModelIndex local_78 [6];
  int local_48;
  int local_44 [7];
  QPersistentModelIndex local_28 [3];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QComboBoxPrivate *)q_func(in_RDI);
  bVar1 = ::operator!=((QModelIndex *)in_stack_ffffffffffffff40,
                       (QPersistentModelIndex *)in_stack_ffffffffffffff38);
  if (!bVar1) {
    if (in_RDI->sizeAdjustPolicy == AdjustToContents) {
      QSize::QSize((QSize *)in_stack_ffffffffffffff40);
      in_RDI->sizeHint = local_10;
      adjustComboBoxSize(in_stack_ffffffffffffff40);
      QWidget::updateGeometry((QWidget *)in_stack_ffffffffffffff40);
    }
    this_01 = in_RDI->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_28);
    iVar2 = (**(code **)(*(long *)this_01 + 0x78))(this_01,local_28);
    if (iVar2 == 0) {
      QModelIndex::QModelIndex((QModelIndex *)0x53649b);
      setCurrentIndex(in_RSI,(QModelIndex *)CONCAT44(in_EDX,in_ECX));
    }
    else {
      iVar2 = QPersistentModelIndex::row();
      if (iVar2 != in_RDI->indexBeforeChange) {
        uVar3 = QPersistentModelIndex::isValid();
        if (((uVar3 & 1) == 0) && (iVar2 = QComboBox::count(in_stack_ffffffffffffff50), iVar2 != 0))
        {
          local_44[0] = QComboBox::count((QComboBox *)this_00);
          iVar2 = (int)((ulong)this_00 >> 0x20);
          local_44[0] = local_44[0] + -1;
          local_48 = 0;
          b = qMax<int>(&in_RDI->indexBeforeChange,&local_48);
          qMin<int>(local_44,b);
          QComboBox::setCurrentIndex((QComboBox *)this_01,iVar2);
        }
        else {
          this_02 = this_00;
          if (in_RDI->lineEdit != (QLineEdit *)0x0) {
            QPersistentModelIndex::row();
            QComboBox::itemText((QComboBox *)in_RSI,in_EDX);
            QLineEdit::setText((QLineEdit *)this_00,(QString *)in_stack_ffffffffffffff38);
            QString::~QString((QString *)0x5365bb);
            updateLineEditGeometry(this_02);
          }
          QWidget::update(in_stack_ffffffffffffff38);
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_78);
          emitCurrentIndexChanged
                    ((QComboBoxPrivate *)CONCAT44(in_EDX,in_ECX),(QModelIndex *)this_02);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::rowsRemoved(const QModelIndex &parent, int /*start*/, int /*end*/)
{
    Q_Q(QComboBox);
    if (parent != root)
        return;

    if (sizeAdjustPolicy == QComboBox::AdjustToContents) {
        sizeHint = QSize();
        adjustComboBoxSize();
        q->updateGeometry();
    }

    // model has removed the last row
    if (model->rowCount(root) == 0) {
        setCurrentIndex(QModelIndex());
        return;
    }

    // model has changed the currentIndex
    if (currentIndex.row() != indexBeforeChange) {
        if (!currentIndex.isValid() && q->count()) {
            q->setCurrentIndex(qMin(q->count() - 1, qMax(indexBeforeChange, 0)));
            return;
        }
        if (lineEdit) {
            lineEdit->setText(q->itemText(currentIndex.row()));
            updateLineEditGeometry();
        }
        q->update();
        emitCurrentIndexChanged(currentIndex);
    }
}